

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O2

VRDatumIntArray * __thiscall MinVR::VRDatumPtr::intArrayVal(VRDatumPtr *this)

{
  VRError *this_00;
  allocator<char> local_a0;
  allocator<char> local_9f;
  allocator<char> local_9e;
  allocator<char> local_9d;
  int local_9c;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if (this->pData->type == VRCORETYPE_INTARRAY) {
    return (VRDatumIntArray *)this->pData;
  }
  this_00 = (VRError *)__cxa_allocate_exception(0xa8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"This datum is not an array of ints.",&local_9d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDatum.h",
             &local_9f);
  local_9c = 0x27b;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"VRDatumIntArray *MinVR::VRDatumPtr::intArrayVal()",&local_a0);
  VRError::VRError(this_00,&local_38,&local_58,&local_78,&local_9c,&local_98);
  __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

VRDatumIntArray* intArrayVal()
  {
    if (pData->getType() == VRCORETYPE_INTARRAY) {
      return static_cast<VRDatumIntArray*>(pData);
    } else {
      VRERRORNOADV("This datum is not an array of ints.");
    }
  }